

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ODUPCEANCommon.h
# Opt level: O2

basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> * __thiscall
ZXing::OneD::UPCEANCommon::ConvertUPCEtoUPCA<std::__cxx11::wstring>
          (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
           *__return_storage_ptr__,UPCEANCommon *this,
          basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *upce)

{
  wchar_t wVar1;
  wchar_t wVar2;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> upceChars;
  
  if (*(ulong *)(this + 8) < 7) {
    std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,(wstring *)this);
    return __return_storage_ptr__;
  }
  std::__cxx11::wstring::substr((ulong)&upceChars,(ulong)this);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = L'\0';
  std::__cxx11::wstring::reserve((ulong)__return_storage_ptr__);
  wVar2 = (wchar_t)__return_storage_ptr__;
  std::__cxx11::wstring::push_back(wVar2);
  wVar1 = upceChars._M_dataplus._M_p[5];
  if ((uint)(wVar1 + L'\xffffffd0') < 3) {
    std::__cxx11::wstring::substr((ulong)local_58,(ulong)&upceChars);
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
    std::__cxx11::wstring::~wstring((wstring *)local_58);
    std::__cxx11::wstring::push_back(wVar2);
    local_58[0] = local_48;
    std::__cxx11::wstring::_M_construct((ulong)local_58,L'\x04');
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
    std::__cxx11::wstring::~wstring((wstring *)local_58);
    std::__cxx11::wstring::substr((ulong)local_58,(ulong)&upceChars);
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  }
  else {
    if (wVar1 != L'3') {
      if (wVar1 == L'4') {
        std::__cxx11::wstring::substr((ulong)local_58,(ulong)&upceChars);
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
        std::__cxx11::wstring::~wstring((wstring *)local_58);
        local_58[0] = local_48;
        std::__cxx11::wstring::_M_construct((ulong)local_58,L'\x05');
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
        std::__cxx11::wstring::~wstring((wstring *)local_58);
      }
      else {
        std::__cxx11::wstring::substr((ulong)local_58,(ulong)&upceChars);
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
        std::__cxx11::wstring::~wstring((wstring *)local_58);
        local_58[0] = local_48;
        std::__cxx11::wstring::_M_construct((ulong)local_58,L'\x04');
        std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
        std::__cxx11::wstring::~wstring((wstring *)local_58);
      }
      std::__cxx11::wstring::push_back(wVar2);
      goto LAB_0017b382;
    }
    std::__cxx11::wstring::substr((ulong)local_58,(ulong)&upceChars);
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
    std::__cxx11::wstring::~wstring((wstring *)local_58);
    local_58[0] = local_48;
    std::__cxx11::wstring::_M_construct((ulong)local_58,L'\x05');
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
    std::__cxx11::wstring::~wstring((wstring *)local_58);
    std::__cxx11::wstring::substr((ulong)local_58,(ulong)&upceChars);
    std::__cxx11::wstring::append((wstring *)__return_storage_ptr__);
  }
  std::__cxx11::wstring::~wstring((wstring *)local_58);
LAB_0017b382:
  if (7 < *(ulong *)(this + 8)) {
    std::__cxx11::wstring::push_back(wVar2);
  }
  std::__cxx11::wstring::~wstring((wstring *)&upceChars);
  return __return_storage_ptr__;
}

Assistant:

StringT ConvertUPCEtoUPCA(const StringT& upce)
{
	if (upce.length() < 7)
		return upce;

	auto upceChars = upce.substr(1, 6);

	StringT result;
	result.reserve(12);
	result += upce[0];
	auto lastChar = upceChars[5];
	switch (lastChar) {
	case '0':
	case '1':
	case '2':
		result += upceChars.substr(0, 2);
		result += lastChar;
		result += StringT(4, '0');
		result += upceChars.substr(2, 3);
		break;
	case '3':
		result += upceChars.substr(0, 3);
		result += StringT(5, '0');
		result += upceChars.substr(3, 2);
		break;
	case '4':
		result += upceChars.substr(0, 4);
		result += StringT(5, '0');
		;
		result += upceChars[4];
		break;
	default:
		result += upceChars.substr(0, 5);
		result += StringT(4, '0');
		result += lastChar;
		break;
	}
	// Only append check digit in conversion if supplied
	if (upce.length() >= 8) {
		result += upce[7];
	}
	return result;
}